

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O3

uint32_t * unpack2_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  *out = (*in & 3) + base;
  out[1] = (*in >> 2 & 3) + base;
  out[2] = (*in >> 4 & 3) + base;
  out[3] = (*in >> 6 & 3) + base;
  out[4] = (*in >> 8 & 3) + base;
  out[5] = (*in >> 10 & 3) + base;
  out[6] = (*in >> 0xc & 3) + base;
  out[7] = (*in >> 0xe & 3) + base;
  return in + 1;
}

Assistant:

uint32_t * unpack2_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  2  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  6  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  10  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  12  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  14  )   % (1U << 2 )  ;
    *out += base;
    out++;

    return in + 1;
}